

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O0

Aig_Man_t * Aig_ManStart(int nNodesMax)

{
  int iVar1;
  Aig_Man_t *p_00;
  Vec_Ptr_t *pVVar2;
  Aig_MmFixed_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t **ppAVar5;
  Aig_Man_t *p;
  int nNodesMax_local;
  
  p._4_4_ = nNodesMax;
  if (nNodesMax < 1) {
    p._4_4_ = 0x2717;
  }
  p_00 = (Aig_Man_t *)malloc(0x210);
  memset(p_00,0,0x210);
  p_00->nTravIds = 1;
  p_00->fCatchExor = 0;
  pVVar2 = Vec_PtrAlloc(100);
  p_00->vCis = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  p_00->vCos = pVVar2;
  pVVar2 = Vec_PtrAlloc(1000);
  p_00->vObjs = pVVar2;
  pVVar2 = Vec_PtrAlloc(100);
  p_00->vBufs = pVVar2;
  pVVar2 = Vec_PtrAlloc(4);
  p_00->unfold2_type_I = pVVar2;
  pVVar2 = Vec_PtrAlloc(4);
  p_00->unfold2_type_II = pVVar2;
  pAVar3 = Aig_MmFixedStart(0x30,p._4_4_);
  p_00->pMemObjs = pAVar3;
  pAVar4 = Aig_ManFetchMemory(p_00);
  p_00->pConst1 = pAVar4;
  *(ulong *)&p_00->pConst1->field_0x18 =
       *(ulong *)&p_00->pConst1->field_0x18 & 0xfffffffffffffff8 | 1;
  *(ulong *)&p_00->pConst1->field_0x18 =
       *(ulong *)&p_00->pConst1->field_0x18 & 0xfffffffffffffff7 | 8;
  p_00->nObjs[1] = p_00->nObjs[1] + 1;
  iVar1 = Abc_PrimeCudd(p._4_4_);
  p_00->nTableSize = iVar1;
  ppAVar5 = (Aig_Obj_t **)malloc((long)p_00->nTableSize << 3);
  p_00->pTable = ppAVar5;
  memset(p_00->pTable,0,(long)p_00->nTableSize << 3);
  return p_00;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the AIG manager.]

  Description [The argument of this procedure is a soft limit on the
  the number of nodes, or 0 if the limit is unknown.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Aig_ManStart( int nNodesMax )
{
    Aig_Man_t * p;
    if ( nNodesMax <= 0 )
        nNodesMax = 10007;
    // start the manager
    p = ABC_ALLOC( Aig_Man_t, 1 );
    memset( p, 0, sizeof(Aig_Man_t) );
    // perform initializations
    p->nTravIds = 1;
    p->fCatchExor = 0;
    // allocate arrays for nodes
    p->vCis  = Vec_PtrAlloc( 100 );
    p->vCos  = Vec_PtrAlloc( 100 );
    p->vObjs = Vec_PtrAlloc( 1000 );
    p->vBufs = Vec_PtrAlloc( 100 );
    //--jlong -- begin
       p->unfold2_type_I = Vec_PtrAlloc( 4);
       p->unfold2_type_II = Vec_PtrAlloc( 4);
       //--jlong -- end
    // prepare the internal memory manager
    p->pMemObjs = Aig_MmFixedStart( sizeof(Aig_Obj_t), nNodesMax );
    // create the constant node
    p->pConst1 = Aig_ManFetchMemory( p );
    p->pConst1->Type = AIG_OBJ_CONST1;
    p->pConst1->fPhase = 1;
    p->nObjs[AIG_OBJ_CONST1]++;
    // start the table
    p->nTableSize = Abc_PrimeCudd( nNodesMax );
    p->pTable = ABC_ALLOC( Aig_Obj_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Aig_Obj_t *) * p->nTableSize );
    return p;
}